

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocInternal<false>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,size_t *pageCount,SegmentBase<Memory::PreReservedVirtualAllocWrapper> **segment)

{
  size_t pageCount_00;
  char *pcVar1;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *local_20;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pageSegment;
  
  pageCount_00 = *pageCount;
  if (this->maxAllocPageCount < pageCount_00) {
    local_20 = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
               AllocSegment(this,pageCount_00);
    if (local_20 == (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      return (char *)0x0;
    }
    pcVar1 = (local_20->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
    *pageCount = (local_20->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                 segmentPageCount -
                 (ulong)(local_20->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                        secondaryAllocPageCount;
  }
  else {
    pcVar1 = AllocPages(this,(uint)pageCount_00,&local_20);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  *segment = &local_20->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>;
  return pcVar1;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocInternal(size_t * pageCount, TSegment ** segment)
{
    char * addr = nullptr;

    if (*pageCount > this->maxAllocPageCount)
    {
        // Don't bother trying to do single chunk allocation here
        // We're allocating a new segment. If the segment size is
        // within a single chunk, great, otherwise, doesn't matter

        // We need some space reserved for secondary allocations
        TSegment * newSegment = this->AllocSegment(*pageCount);
        if (newSegment != nullptr)
        {
            addr = newSegment->GetAddress();
            *pageCount = newSegment->GetAvailablePageCount();
            *segment = newSegment;
        }
    }
    else
    {
        Assert(*pageCount <= UINT_MAX);
        TPageSegment * pageSegment;

        if (doPageAlign)
        {
            // TODO: Remove this entire codepath since doPageAlign is not being used anymore
            addr = this->AllocPagesPageAligned((uint)*pageCount, &pageSegment);
        }
        else
        {
            addr = this->AllocPages((uint) *pageCount, &pageSegment);
        }

        if (addr != nullptr)
        {
            *segment = pageSegment;
        }
    }
    return addr;
}